

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

UINT8 DeinitAudioSystem(void)

{
  UINT8 in_AL;
  
  if (audDrv != (void *)0x0) {
    AudioDrv_Deinit(&audDrv);
    audDrv = (void *)0x0;
  }
  if (audDrvLog != (void *)0x0) {
    AudioDrv_Deinit(&audDrvLog);
    audDrvLog = (void *)0x0;
  }
  Audio_Deinit();
  OSMutex_Deinit(renderMtx);
  renderMtx = (OS_MUTEX *)0x0;
  return in_AL;
}

Assistant:

static UINT8 DeinitAudioSystem(void)
{
	UINT8 retVal;
	
	retVal = 0x00;
	if (audDrv != NULL)
	{
		retVal = AudioDrv_Deinit(&audDrv);	audDrv = NULL;
	}
	if (audDrvLog != NULL)
	{
		AudioDrv_Deinit(&audDrvLog);	audDrvLog = NULL;
	}
	Audio_Deinit();
	
	OSMutex_Deinit(renderMtx);	renderMtx = NULL;
	
	return retVal;
}